

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  sqlite3 *db;
  LogEst LVar1;
  short sVar2;
  WhereTerm *__dest;
  Expr *pEVar3;
  WhereTerm *pWVar4;
  int iVar5;
  
  iVar5 = pWC->nTerm;
  if (pWC->nSlot <= iVar5) {
    pWVar4 = pWC->a;
    db = pWC->pWInfo->pParse->db;
    __dest = (WhereTerm *)sqlite3WhereMalloc(pWC->pWInfo,(long)pWC->nSlot * 0x70);
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if ((wtFlags & 1) != 0) {
        sqlite3ExprDelete(db,p);
      }
      pWC->a = pWVar4;
      return 0;
    }
    memcpy(__dest,pWVar4,(long)pWC->nTerm * 0x38);
    pWC->nSlot = pWC->nSlot << 1;
    iVar5 = pWC->nTerm;
  }
  pWC->nTerm = iVar5 + 1;
  if ((wtFlags & 2) == 0) {
    pWC->nBase = iVar5 + 1;
  }
  pWVar4 = pWC->a + iVar5;
  sVar2 = 1;
  if ((p != (Expr *)0x0) && ((p->flags & 0x80000) != 0)) {
    LVar1 = sqlite3LogEst((long)p->iTable);
    sVar2 = LVar1 + -0x10e;
  }
  pWVar4->truthProb = sVar2;
  pEVar3 = sqlite3ExprSkipCollateAndLikely(p);
  pWVar4->pExpr = pEVar3;
  pWVar4->wtFlags = wtFlags;
  pWVar4->pWC = pWC;
  pWVar4->eOperator = 0;
  pWVar4->nChild = '\0';
  pWVar4->eMatchOp = '\0';
  pWVar4->iParent = 0;
  *(undefined8 *)&pWVar4->leftCursor = 0;
  *(undefined8 *)((long)&pWVar4->u + 4) = 0;
  *(undefined8 *)((long)&pWVar4->prereqRight + 4) = 0;
  *(undefined4 *)((long)&pWVar4->prereqAll + 4) = 0;
  return iVar5;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3WhereMalloc(pWC->pWInfo, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    pWC->nSlot = pWC->nSlot*2;
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( (wtFlags & TERM_VIRTUAL)==0 ) pWC->nBase = pWC->nTerm;
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollateAndLikely(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}